

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

type_equivalence typeEquivalence(UA_DataType *t)

{
  byte bVar1;
  UA_UInt16 UVar2;
  type_equivalence tVar3;
  
  tVar3 = TYPE_EQUIVALENCE_NONE;
  if (t->membersSize == '\x01') {
    bVar1 = t->members->field_0xb;
    tVar3 = TYPE_EQUIVALENCE_NONE;
    if ((bVar1 & 1) != 0) {
      UVar2 = t->members->memberTypeIndex;
      if (UVar2 == 5) {
        tVar3 = TYPE_EQUIVALENCE_ENUM;
      }
      else {
        tVar3 = TYPE_EQUIVALENCE_NONE;
        if ((UVar2 == 2) && ((bVar1 & 2) != 0)) {
          tVar3 = TYPE_EQUIVALENCE_OPAQUE;
        }
      }
    }
  }
  return tVar3;
}

Assistant:

static enum type_equivalence
typeEquivalence(const UA_DataType *t) {
    if(t->membersSize != 1 || !t->members[0].namespaceZero)
        return TYPE_EQUIVALENCE_NONE;
    if(t->members[0].memberTypeIndex == UA_TYPES_INT32)
        return TYPE_EQUIVALENCE_ENUM;
    if(t->members[0].memberTypeIndex == UA_TYPES_BYTE && t->members[0].isArray)
        return TYPE_EQUIVALENCE_OPAQUE;
    return TYPE_EQUIVALENCE_NONE;
}